

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaBlockVector::VmaBlockVector
          (VmaBlockVector *this,VmaAllocator hAllocator,VmaPool hParentPool,uint32_t memoryTypeIndex
          ,VkDeviceSize preferredBlockSize,size_t minBlockCount,size_t maxBlockCount,
          VkDeviceSize bufferImageGranularity,bool explicitBlockSize,uint32_t algorithm,
          float priority,VkDeviceSize minAllocationAlignment,void *pMemoryAllocateNext)

{
  VkAllocationCallbacks *pVVar1;
  
  this->m_hAllocator = hAllocator;
  this->m_hParentPool = hParentPool;
  this->m_MemoryTypeIndex = memoryTypeIndex;
  this->m_PreferredBlockSize = preferredBlockSize;
  this->m_MinBlockCount = minBlockCount;
  this->m_MaxBlockCount = maxBlockCount;
  this->m_BufferImageGranularity = bufferImageGranularity;
  this->m_ExplicitBlockSize = explicitBlockSize;
  this->m_Algorithm = algorithm;
  this->m_Priority = priority;
  this->m_MinAllocationAlignment = minAllocationAlignment;
  this->m_pMemoryAllocateNext = pMemoryAllocateNext;
  (this->m_Mutex).m_Mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).m_Mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).m_Mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).m_Mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).m_Mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->m_Mutex).m_Mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_Mutex).m_Mutex._M_impl._M_rwlock + 0x30) = 0;
  pVVar1 = &hAllocator->m_AllocationCallbacks;
  if (hAllocator->m_AllocationCallbacksSpecified == false) {
    pVVar1 = (VkAllocationCallbacks *)0x0;
  }
  (this->m_Blocks).m_Allocator.m_pCallbacks = pVVar1;
  (this->m_Blocks).m_pArray = (VmaDeviceMemoryBlock **)0x0;
  (this->m_Blocks).m_Count = 0;
  *(undefined8 *)((long)&(this->m_Blocks).m_Count + 4) = 0;
  *(undefined8 *)((long)&(this->m_Blocks).m_Capacity + 4) = 0;
  this->m_IncrementalSort = true;
  return;
}

Assistant:

VmaBlockVector::VmaBlockVector(
    VmaAllocator hAllocator,
    VmaPool hParentPool,
    uint32_t memoryTypeIndex,
    VkDeviceSize preferredBlockSize,
    size_t minBlockCount,
    size_t maxBlockCount,
    VkDeviceSize bufferImageGranularity,
    bool explicitBlockSize,
    uint32_t algorithm,
    float priority,
    VkDeviceSize minAllocationAlignment,
    void* pMemoryAllocateNext)
    : m_hAllocator(hAllocator),
    m_hParentPool(hParentPool),
    m_MemoryTypeIndex(memoryTypeIndex),
    m_PreferredBlockSize(preferredBlockSize),
    m_MinBlockCount(minBlockCount),
    m_MaxBlockCount(maxBlockCount),
    m_BufferImageGranularity(bufferImageGranularity),
    m_ExplicitBlockSize(explicitBlockSize),
    m_Algorithm(algorithm),
    m_Priority(priority),
    m_MinAllocationAlignment(minAllocationAlignment),
    m_pMemoryAllocateNext(pMemoryAllocateNext),
    m_Blocks(VmaStlAllocator<VmaDeviceMemoryBlock*>(hAllocator->GetAllocationCallbacks())),
    m_NextBlockId(0) {}